

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::replaceFieldTypes
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *pattern,UnicodeString *skeleton,UDateTimePatternMatchOptions options,
          UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UDateTimePatternMatchOptions options_local;
  UnicodeString *skeleton_local;
  UnicodeString *pattern_local;
  DateTimePatternGenerator *this_local;
  UnicodeString *result;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->internalErrorCode);
    if (UVar1 == '\0') {
      DateTimeMatcher::set(this->dtMatcher,skeleton,this->fp);
      adjustFieldTypes(__return_storage_ptr__,this,pattern,(PtnSkeleton *)0x0,0,options);
    }
    else {
      *status = this->internalErrorCode;
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
    }
  }
  else {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::replaceFieldTypes(const UnicodeString& pattern,
                                            const UnicodeString& skeleton,
                                            UDateTimePatternMatchOptions options,
                                            UErrorCode& status) {
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    if (U_FAILURE(internalErrorCode)) {
        status = internalErrorCode;
        return UnicodeString();
    }
    dtMatcher->set(skeleton, fp);
    UnicodeString result = adjustFieldTypes(pattern, nullptr, kDTPGNoFlags, options);
    return result;
}